

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

ArrayIndex __thiscall Json::Value::size(Value *this)

{
  ArrayIndex AVar1;
  long lVar2;
  
  if (this->field_0x8 == '\b') {
    AVar1 = (ArrayIndex)(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    AVar1 = 0;
    if ((this->field_0x8 == '\a') &&
       ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      lVar2 = std::_Rb_tree_decrement
                        (&(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header);
      return *(int *)(lVar2 + 0x28) + 1;
    }
  }
  return AVar1;
}

Assistant:

ArrayIndex Value::size() const {
  switch (type_) {
  case nullValue:
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
  case stringValue:
    return 0;
  case arrayValue: // size of the array is highest index + 1
    if (!value_.map_->empty()) {
      ObjectValues::const_iterator itLast = value_.map_->end();
      --itLast;
      return (*itLast).first.index() + 1;
    }
    return 0;
  case objectValue:
    return ArrayIndex(value_.map_->size());
  }
  JSON_ASSERT_UNREACHABLE;
  return 0; // unreachable;
}